

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BufferStartCase::iterate(BufferStartCase *this)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  TestError *this_00;
  int ndx;
  GLuint index;
  allocator<char> local_11a;
  allocator<char> local_119;
  ScopedLogSection section_1;
  int offset;
  string local_108;
  CallLogWrapper gl;
  string local_d0;
  int maxBindings;
  ScopedLogSection superSection;
  ScopedLogSection section;
  GLuint local_90;
  Buffer bufferB;
  ResultCollector result;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108," // ERROR: ",(allocator<char> *)&local_d0);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  maxBindings = -1;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,this->m_numBindingsTarget,&maxBindings);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x13c);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Initial",(allocator<char> *)&bufferB);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Initial value",(allocator<char> *)&superSection);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_108,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_108);
  for (iVar2 = 0; iVar2 < maxBindings; iVar2 = iVar2 + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,this->m_queryTarget,iVar2,0,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"AfterSetting",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"After setting",(allocator<char> *)&bufferB);
  tcu::ScopedLogSection::ScopedLogSection(&superSection,pTVar1,&local_108,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_108);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&section,
             ((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&bufferB,((this->super_TestCase).m_context)->m_renderCtx);
  iVar2 = maxBindings;
  index = maxBindings / 2;
  offset = -1;
  if (this->m_bufferTarget == 0x90d2) {
    glu::CallLogWrapper::glGetIntegerv(&gl,0x90df,&offset);
    GVar3 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar3,"get align",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                    ,0x153);
    if (offset < 0) goto LAB_004c04ad;
  }
  else {
    if (this->m_bufferTarget != 0x92c0) {
LAB_004c04ad:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"offset >= 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                 ,0x158);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    offset = 4;
  }
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Generic",&local_119);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"After setting generic binding point",&local_11a);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_108);
  glu::CallLogWrapper::glBindBuffer(&gl,this->m_bufferTarget,local_90);
  glu::CallLogWrapper::glBufferData(&gl,this->m_bufferTarget,0x10,(void *)0x0,0x88e9);
  glu::CallLogWrapper::glBindBuffer(&gl,this->m_bufferTarget,bufferB.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBufferData(&gl,this->m_bufferTarget,0x20,(void *)0x0,0x88e9);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"gen bufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x161);
  gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,this->m_queryTarget,0,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Indexed",&local_119);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"After setting with glBindBufferBase",&local_11a);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_108);
  glu::CallLogWrapper::glBindBufferBase(&gl,this->m_bufferTarget,0,local_90);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"bind buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x169);
  gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,this->m_queryTarget,0,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"Indexed",&local_119);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"After setting with glBindBufferRange",&local_11a);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_108);
  glu::CallLogWrapper::glBindBufferRange
            (&gl,this->m_bufferTarget,index,bufferB.super_ObjectWrapper.m_object,(long)offset,8);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar3,"bind buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x171);
  gls::StateQueryUtil::verifyStateIndexedInteger
            (&result,&gl,this->m_queryTarget,index,offset,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  if (2 < iVar2 + 1U) {
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"DifferentStates",&local_119);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Original state did not change",&local_11a);
    tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_108,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_108);
    gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,this->m_queryTarget,0,0,this->m_verifierType);
    tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  }
  glu::ObjectWrapper::~ObjectWrapper(&bufferB.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&section);
  tcu::ScopedLogSection::~ScopedLogSection(&superSection);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

BufferStartCase::IterateResult BufferStartCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						maxBindings	= -1;

	gl.enableLogging(true);

	gl.glGetIntegerv(m_numBindingsTarget, &maxBindings);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxBindings; ++ndx)
			verifyStateIndexedInteger(result, gl, m_queryTarget, ndx, 0, m_verifierType);
	}


	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSetting", "After setting");
		glu::Buffer					bufferA			(m_context.getRenderContext());
		glu::Buffer					bufferB			(m_context.getRenderContext());
		const int					ndxA			= 0;
		const int					ndxB			= maxBindings / 2;
		int							offset			= -1;

		if (m_bufferTarget == GL_ATOMIC_COUNTER_BUFFER)
			offset = 4;
		else if (m_bufferTarget == GL_SHADER_STORAGE_BUFFER)
		{
			gl.glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &offset);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "get align");
		}
		else
			DE_ASSERT(false);

		TCU_CHECK(offset >= 0);

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Generic", "After setting generic binding point");

			gl.glBindBuffer(m_bufferTarget, *bufferA);
			gl.glBufferData(m_bufferTarget, 16, DE_NULL, GL_DYNAMIC_READ);
			gl.glBindBuffer(m_bufferTarget, *bufferB);
			gl.glBufferData(m_bufferTarget, 32, DE_NULL, GL_DYNAMIC_READ);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen bufs");

			verifyStateIndexedInteger(result, gl, m_queryTarget, 0, 0, m_verifierType);
		}
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Indexed", "After setting with glBindBufferBase");

			gl.glBindBufferBase(m_bufferTarget, ndxA, *bufferA);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind buf");

			verifyStateIndexedInteger(result, gl, m_queryTarget, ndxA, 0, m_verifierType);
		}
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Indexed", "After setting with glBindBufferRange");

			gl.glBindBufferRange(m_bufferTarget, ndxB, *bufferB, offset, 8);
			GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind buf");

			verifyStateIndexedInteger(result, gl, m_queryTarget, ndxB, offset, m_verifierType);
		}
		if (ndxA != ndxB)
		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "DifferentStates", "Original state did not change");

			verifyStateIndexedInteger(result, gl, m_queryTarget, ndxA, 0, m_verifierType);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}